

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_ULong FT_Stream_ReadULongLE(FT_Stream stream,FT_Error *error)

{
  unsigned_long uVar1;
  FT_ULong FVar2;
  uint *puVar3;
  FT_Byte reads [4];
  uint local_1c;
  
  *error = 0;
  uVar1 = stream->pos;
  if (uVar1 + 3 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      puVar3 = (uint *)(stream->base + uVar1);
    }
    else {
      puVar3 = &local_1c;
      uVar1 = (*stream->read)(stream,uVar1,(uchar *)puVar3,4);
      if (uVar1 != 4) goto LAB_00138703;
    }
    if (puVar3 == (uint *)0x0) {
      FVar2 = 0;
    }
    else {
      FVar2 = (FT_ULong)*puVar3;
    }
    stream->pos = stream->pos + 4;
  }
  else {
LAB_00138703:
    *error = 0x55;
    FVar2 = 0;
  }
  return FVar2;
}

Assistant:

FT_BASE_DEF( FT_ULong )
  FT_Stream_ReadULongLE( FT_Stream  stream,
                         FT_Error*  error )
  {
    FT_Byte   reads[4];
    FT_Byte*  p      = 0;
    FT_ULong  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->pos + 3 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 4L ) != 4L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_ULONG_LE( p );
    }
    else
      goto Fail;

    stream->pos += 4;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadULongLE:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }